

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>::
emplaceRealloc<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
           *this,pointer pos,
          pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator ppVar4;
  long lVar5;
  pointer ppVar6;
  pointer ppVar7;
  iterator __result;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
  *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
          ::max_size((SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
                      *)0xa0db5b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
          ::calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  ppVar4 = SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
           ::begin(in_RDI);
  lVar5 = (long)__last - (long)ppVar4;
  ppVar6 = (pointer)operator_new(0xa0dbba);
  ppVar7 = ppVar6 + (lVar5 >> 4);
  ppVar7->first = (ValueSymbol *)*in_RDX;
  ppVar7->second = (Expression *)in_RDX[1];
  ppVar4 = SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
           ::end(in_RDI);
  if (in_RSI == ppVar4) {
    __result = SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
               ::begin(in_RDI);
    ppVar4 = SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
             ::end(in_RDI);
    std::
    uninitialized_move<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>*,std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>*>
              (in_RSI,__last,__result);
  }
  else {
    SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>::
    begin(in_RDI);
    std::
    uninitialized_move<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>*,std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ppVar4 = SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
             ::end(in_RDI);
    std::
    uninitialized_move<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>*,std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>::
  cleanup(in_RDI,(EVP_PKEY_CTX *)ppVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = ppVar6;
  return ppVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}